

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

PerThreadSynch * absl::lts_20250127::Synch_GetPerThreadAnnotated(Mutex *mu)

{
  PerThreadSynch *pPVar1;
  PerThreadSynch *w;
  Mutex *mu_local;
  
  pPVar1 = Synch_GetPerThread();
  return pPVar1;
}

Assistant:

static PerThreadSynch* Synch_GetPerThreadAnnotated(Mutex* mu) {
  if (mu) {
    ABSL_TSAN_MUTEX_PRE_DIVERT(mu, 0);
  }
  PerThreadSynch* w = Synch_GetPerThread();
  if (mu) {
    ABSL_TSAN_MUTEX_POST_DIVERT(mu, 0);
  }
  return w;
}